

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O0

void snga_local_transpose(Integer type,char *ptra,Integer n,Integer stride,char *ptrb)

{
  long in_RCX;
  undefined8 *puVar1;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  undefined8 *in_R8;
  Integer i;
  Integer in_stack_00000168;
  char *in_stack_00000170;
  long local_30;
  undefined8 *local_28;
  
  local_28 = in_R8;
  switch(in_RDI) {
  case 0x3e9:
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      *(undefined4 *)local_28 = *(undefined4 *)(in_RSI + local_30 * 4);
      local_28 = (undefined8 *)(in_RCX + (long)local_28);
    }
    break;
  case 0x3ea:
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      *local_28 = *(undefined8 *)(in_RSI + local_30 * 8);
      local_28 = (undefined8 *)(in_RCX + (long)local_28);
    }
    break;
  case 0x3eb:
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      *(undefined4 *)local_28 = *(undefined4 *)(in_RSI + local_30 * 4);
      local_28 = (undefined8 *)(in_RCX + (long)local_28);
    }
    break;
  case 0x3ec:
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      *local_28 = *(undefined8 *)(in_RSI + local_30 * 8);
      local_28 = (undefined8 *)(in_RCX + (long)local_28);
    }
    break;
  default:
    pnga_error(in_stack_00000170,in_stack_00000168);
    break;
  case 0x3ee:
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      *local_28 = *(undefined8 *)(in_RSI + local_30 * 8);
      local_28 = (undefined8 *)(in_RCX + (long)local_28);
    }
    break;
  case 0x3ef:
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      puVar1 = (undefined8 *)(in_RSI + local_30 * 0x10);
      *local_28 = *puVar1;
      local_28[1] = puVar1[1];
      local_28 = (undefined8 *)(in_RCX + (long)local_28);
    }
    break;
  case 0x3f8:
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      *local_28 = *(undefined8 *)(in_RSI + local_30 * 8);
      local_28 = (undefined8 *)(in_RCX + (long)local_28);
    }
  }
  return;
}

Assistant:

static 
void snga_local_transpose(Integer type, char *ptra, Integer n, Integer stride, char *ptrb)
{
Integer i;
    switch(type){

       case C_INT:
            for(i = 0; i< n; i++, ptrb+= stride) 
               *(int*)ptrb= ((int*)ptra)[i];
            break;
       case C_DCPL:
            for(i = 0; i< n; i++, ptrb+= stride) 
               *(DoubleComplex*)ptrb= ((DoubleComplex*)ptra)[i];
            break;
       case C_SCPL:
            for(i = 0; i< n; i++, ptrb+= stride) 
               *(SingleComplex*)ptrb= ((SingleComplex*)ptra)[i];
            break;
       case C_DBL:
            for(i = 0; i< n; i++, ptrb+= stride) 
               *(double*)ptrb= ((double*)ptra)[i];
            break;
       case C_FLOAT:
            for(i = 0; i< n; i++, ptrb+= stride)
               *(float*)ptrb= ((float*)ptra)[i];
            break;      
       case C_LONG:
            for(i = 0; i< n; i++, ptrb+= stride)
               *(long*)ptrb= ((long*)ptra)[i];
            break;                                 
       case C_LONGLONG:
            for(i = 0; i< n; i++, ptrb+= stride)
               *(long long*)ptrb= ((long long*)ptra)[i];
            break;                                 
       default: pnga_error("bad type:",type);
    }
}